

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

void EPSG_writeReg(EPSG *psg,UINT8 reg,UINT8 val)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  int c;
  UINT8 val_local;
  UINT8 reg_local;
  EPSG *psg_local;
  
  if (reg < 0x10) {
    bVar1 = val & regmsk[reg];
    psg->reg[reg] = bVar1;
    switch(reg) {
    case '\0':
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
      iVar3 = (int)(uint)reg >> 1;
      psg->freq[iVar3] = (psg->reg[iVar3 * 2 + 1] & 0xf) * 0x100 + (ushort)psg->reg[iVar3 << 1];
      break;
    case '\x06':
      psg->noise_freq = (bVar1 & 0x1f) << 1;
      break;
    case '\a':
      psg->tmask[0] = bVar1 & 1;
      psg->tmask[1] = bVar1 & 2;
      psg->tmask[2] = bVar1 & 4;
      psg->nmask[0] = bVar1 & 8;
      psg->nmask[1] = bVar1 & 0x10;
      psg->nmask[2] = bVar1 & 0x20;
      break;
    case '\b':
    case '\t':
    case '\n':
      psg->volume[(int)(reg - 8)] = bVar1 << 1;
      break;
    case '\v':
    case '\f':
      psg->env_freq = (uint)psg->reg[0xc] * 0x100 + (uint)psg->reg[0xb];
      break;
    case '\r':
      psg->env_continue = (byte)((int)(uint)bVar1 >> 3) & 1;
      psg->env_attack = (byte)((int)(uint)bVar1 >> 2) & 1;
      psg->env_alternate = (byte)((int)(uint)bVar1 >> 1) & 1;
      psg->env_hold = bVar1 & 1;
      psg->env_face = psg->env_attack;
      psg->env_pause = '\0';
      psg->env_count = 0x10000 - psg->env_freq;
      uVar2 = '\x1f';
      if (psg->env_face != '\0') {
        uVar2 = '\0';
      }
      psg->env_ptr = uVar2;
      break;
    case '\x0e':
    case '\x0f':
    }
  }
  return;
}

Assistant:

void
EPSG_writeReg (EPSG * psg, UINT8 reg, UINT8 val)
{
  int c;

  if (reg > 15) return;

  val &= regmsk[reg];

  psg->reg[reg] = val;
  switch (reg)
  {
  case 0:
  case 2:
  case 4:
  case 1:
  case 3:
  case 5:
    c = reg >> 1;
    psg->freq[c] = ((psg->reg[c * 2 + 1] & 15) << 8) + psg->reg[c * 2];
    break;

  case 6:
    psg->noise_freq = (val & 31) << 1;
    break;

  case 7:
    psg->tmask[0] = (val & 1);
    psg->tmask[1] = (val & 2);
    psg->tmask[2] = (val & 4);
    psg->nmask[0] = (val & 8);
    psg->nmask[1] = (val & 16);
    psg->nmask[2] = (val & 32);
    break;

  case 8:
  case 9:
  case 10:
    psg->volume[reg - 8] = val << 1;
    break;

  case 11:
  case 12:
    psg->env_freq = (psg->reg[12] << 8) + psg->reg[11];
    break;

  case 13:
    psg->env_continue = (val >> 3) & 1;
    psg->env_attack = (val >> 2) & 1;
    psg->env_alternate = (val >> 1) & 1;
    psg->env_hold = val & 1;
    psg->env_face = psg->env_attack;
    psg->env_pause = 0;
    psg->env_count = 0x10000 - psg->env_freq;
    psg->env_ptr = psg->env_face?0:0x1f;
    break;

  case 14:
  case 15:
  default:
    break;
  }

  return;
}